

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jobs.cpp
# Opt level: O3

void __thiscall
JsUtil::BackgroundJobProcessor::RemoveManager(BackgroundJobProcessor *this,JobManager *manager)

{
  CriticalSection *this_00;
  DoublyLinkedList<JsUtil::Job,_Memory::ArenaAllocator> *head;
  Type *tail;
  JobProcessor *pJVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  undefined4 *puVar5;
  BackgroundJobProcessor *pBVar6;
  Job *pJVar7;
  ParallelThreadData *parallelThreadData;
  JobProcessor *first;
  undefined **this_01;
  char *pcVar8;
  JobProcessor *pJVar9;
  WaitableJobManager *waitableManager;
  
  if (manager == (JobManager *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
                       ,0x372,"(manager)","manager");
    if (!bVar3) goto LAB_0067cb74;
    *puVar5 = 0;
  }
  this_00 = &this->criticalSection;
  CCLock::Enter(&this_00->super_CCLock);
  pBVar6 = this;
  do {
    pBVar6 = (BackgroundJobProcessor *)(pBVar6->super_JobProcessor).managers.head;
    if (pBVar6 == (BackgroundJobProcessor *)manager) break;
  } while (pBVar6 != (BackgroundJobProcessor *)0x0);
  if (pBVar6 != (BackgroundJobProcessor *)0x0) {
    this_01 = (undefined **)manager;
    DoublyLinkedListElement<JsUtil::JobManager,_Memory::ArenaAllocator>::
    UnlinkPartial<JsUtil::JobManager>
              (manager,&(this->super_JobProcessor).managers.head,
               &(this->super_JobProcessor).managers.tail);
    (manager->super_DoublyLinkedListElement<JsUtil::JobManager,_Memory::ArenaAllocator>).previous =
         (Type)0x0;
    (manager->super_DoublyLinkedListElement<JsUtil::JobManager,_Memory::ArenaAllocator>).next =
         (Type)0x0;
    if (manager->numJobsAddedToProcessor != 0) {
      pJVar9 = (JobProcessor *)(this->super_JobProcessor).jobs.head;
      if (pJVar9 != (JobProcessor *)0x0) {
        head = &(this->super_JobProcessor).jobs;
        tail = &(this->super_JobProcessor).jobs.tail;
        this_01 = &PTR_01548f08;
        puVar5 = (undefined4 *)__tls_get_addr();
        first = (JobProcessor *)0x0;
        do {
          if ((pJVar9->managers).head == manager) {
            if (first == (JobProcessor *)0x0) {
              first = pJVar9;
            }
          }
          else if (first == (JobProcessor *)0x0) {
            first = (JobProcessor *)0x0;
          }
          else {
            this_01 = (undefined **)first;
            DoublyLinkedListElement<JsUtil::Job,_Memory::ArenaAllocator>::
            UnlinkSubsequence<JsUtil::Job>
                      ((Job *)first,
                       ((DoublyLinkedListElement<JsUtil::Job,_Memory::ArenaAllocator> *)
                       &pJVar9->_vptr_JobProcessor)->previous,&head->head,tail);
            do {
              pJVar1 = (JobProcessor *)
                       ((DoublyLinkedListElement<JsUtil::JobManager,_Memory::ArenaAllocator> *)
                       &first->processesInBackground)->previous;
              if (*(bool *)&(first->managers).tail == true) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar5 = 1;
                pcVar8 = 
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
                ;
                bVar3 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
                                   ,0x395,"(!removedJob->IsCritical())","!removedJob->IsCritical()")
                ;
                if (!bVar3) goto LAB_0067cb74;
                *puVar5 = 0;
                this_01 = (undefined **)pcVar8;
              }
              uVar4 = this->numJobs;
              if (uVar4 == 0) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar5 = 1;
                pcVar8 = 
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
                ;
                bVar3 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
                                   ,0x396,"(numJobs != 0)","numJobs != 0");
                if (!bVar3) goto LAB_0067cb74;
                *puVar5 = 0;
                uVar4 = this->numJobs;
                this_01 = (undefined **)pcVar8;
              }
              this->numJobs = uVar4 - 1;
              JobProcessor::JobProcessed((JobProcessor *)this_01,manager,(Job *)first,false);
              uVar4 = manager->numJobsAddedToProcessor;
              if (uVar4 == 0) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar5 = 1;
                pcVar8 = 
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
                ;
                bVar3 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
                                   ,0x399,"(manager->numJobsAddedToProcessor != 0)",
                                   "manager->numJobsAddedToProcessor != 0");
                if (!bVar3) goto LAB_0067cb74;
                *puVar5 = 0;
                uVar4 = manager->numJobsAddedToProcessor;
                this_01 = (undefined **)pcVar8;
              }
              manager->numJobsAddedToProcessor = uVar4 - 1;
              if ((manager->isWaitable == true) &&
                 ((JobProcessor *)manager[1]._vptr_JobManager == first)) {
                this_01 = (undefined **)
                          manager[1].
                          super_DoublyLinkedListElement<JsUtil::JobManager,_Memory::ArenaAllocator>.
                          previous;
                SetEvent(this_01);
                manager[1]._vptr_JobManager = (_func_int **)0x0;
              }
              first = pJVar1;
            } while (pJVar1 != (JobProcessor *)0x0);
            first = (JobProcessor *)0x0;
          }
          pJVar9 = (JobProcessor *)
                   ((DoublyLinkedListElement<JsUtil::JobManager,_Memory::ArenaAllocator> *)
                   &pJVar9->processesInBackground)->previous;
        } while (pJVar9 != (JobProcessor *)0x0);
        if (first != (JobProcessor *)0x0) {
          DoublyLinkedListElement<JsUtil::Job,_Memory::ArenaAllocator>::
          UnlinkSubsequenceFromEnd<JsUtil::Job>((Job *)first,&head->head,tail);
          this_01 = &PTR_01548f08;
          puVar5 = (undefined4 *)__tls_get_addr();
          do {
            pJVar9 = (JobProcessor *)
                     ((DoublyLinkedListElement<JsUtil::JobManager,_Memory::ArenaAllocator> *)
                     &first->processesInBackground)->previous;
            if (*(bool *)&(first->managers).tail == true) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar5 = 1;
              pcVar8 = 
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
              ;
              bVar3 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
                                 ,0x3af,"(!removedJob->IsCritical())","!removedJob->IsCritical()");
              if (!bVar3) goto LAB_0067cb74;
              *puVar5 = 0;
              this_01 = (undefined **)pcVar8;
            }
            uVar4 = this->numJobs;
            if (uVar4 == 0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar5 = 1;
              pcVar8 = 
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
              ;
              bVar3 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
                                 ,0x3b0,"(numJobs != 0)","numJobs != 0");
              if (!bVar3) goto LAB_0067cb74;
              *puVar5 = 0;
              uVar4 = this->numJobs;
              this_01 = (undefined **)pcVar8;
            }
            this->numJobs = uVar4 - 1;
            JobProcessor::JobProcessed((JobProcessor *)this_01,manager,(Job *)first,false);
            uVar4 = manager->numJobsAddedToProcessor;
            if (uVar4 == 0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar5 = 1;
              pcVar8 = 
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
              ;
              bVar3 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
                                 ,0x3b3,"(manager->numJobsAddedToProcessor != 0)",
                                 "manager->numJobsAddedToProcessor != 0");
              if (!bVar3) goto LAB_0067cb74;
              *puVar5 = 0;
              uVar4 = manager->numJobsAddedToProcessor;
              this_01 = (undefined **)pcVar8;
            }
            manager->numJobsAddedToProcessor = uVar4 - 1;
            if ((manager->isWaitable == true) &&
               ((JobProcessor *)manager[1]._vptr_JobManager == first)) {
              this_01 = (undefined **)
                        manager[1].
                        super_DoublyLinkedListElement<JsUtil::JobManager,_Memory::ArenaAllocator>.
                        previous;
              SetEvent(this_01);
              manager[1]._vptr_JobManager = (_func_int **)0x0;
            }
            first = pJVar9;
          } while (pJVar9 != (JobProcessor *)0x0);
        }
      }
      uVar4 = manager->numJobsAddedToProcessor;
      if (uVar4 == 0) {
        JobProcessor::LastJobProcessed((JobProcessor *)this_01,manager);
      }
      else {
        if (manager->isWaitable == false) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar5 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
                             ,0x3c9,"(manager->isWaitable)","manager->isWaitable");
          if (!bVar3) goto LAB_0067cb74;
          *puVar5 = 0;
        }
        pJVar7 = GetCurrentJobOfManager(this,manager);
        if (pJVar7 == (Job *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar5 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
                             ,0x3ca,"(GetCurrentJobOfManager(manager))",
                             "GetCurrentJobOfManager(manager)");
          if (!bVar3) goto LAB_0067cb74;
          *puVar5 = 0;
        }
      }
      CCLock::Leave(&this_00->super_CCLock);
      if (uVar4 == 0) {
        return;
      }
      CCLock::Enter(&this_00->super_CCLock);
      pJVar7 = GetCurrentJobOfManager(this,manager);
      if (pJVar7 != (Job *)0x0) {
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        do {
          if (manager[1]._vptr_JobManager != (_func_int **)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar5 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
                               ,0x3d9,"(!waitableManager->jobBeingWaitedUpon)",
                               "!waitableManager->jobBeingWaitedUpon");
            if (!bVar3) goto LAB_0067cb74;
            *puVar5 = 0;
          }
          manager[1]._vptr_JobManager = (_func_int **)pJVar7;
          ResetEvent(manager[1].
                     super_DoublyLinkedListElement<JsUtil::JobManager,_Memory::ArenaAllocator>.
                     previous);
          parallelThreadData = GetThreadDataFromCurrentJob(this,(Job *)manager[1]._vptr_JobManager);
          CCLock::Leave(&this_00->super_CCLock);
          WaitWithThread(this,parallelThreadData,
                         (Event *)&manager[1].
                                   super_DoublyLinkedListElement<JsUtil::JobManager,_Memory::ArenaAllocator>
                         ,0xffffffff);
          CCLock::Enter(&this_00->super_CCLock);
          manager[1]._vptr_JobManager = (_func_int **)0x0;
          pJVar7 = GetCurrentJobOfManager(this,manager);
        } while (pJVar7 != (Job *)0x0);
      }
      CCLock::Leave(&this_00->super_CCLock);
      return;
    }
    pJVar7 = GetCurrentJobOfManager(this,manager);
    if (pJVar7 != (Job *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
                         ,0x382,"(!GetCurrentJobOfManager(manager))",
                         "!GetCurrentJobOfManager(manager)");
      if (!bVar3) {
LAB_0067cb74:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
  }
  CCLock::Leave(&this_00->super_CCLock);
  return;
}

Assistant:

void BackgroundJobProcessor::RemoveManager(JobManager *const manager)
    {
        Assert(manager);

        ParallelThreadData *threadDataProcessingCurrentJob = nullptr;
        {
            AutoCriticalSection lock(&criticalSection);
            // Managers must remove themselves. Hence, Close does not remove managers. So, not asserting on !IsClosed().

            if (!HasManager(manager))
            {
                // Since this manager isn't owned by this processor, no need to remove and cleanup
                return;
            }

            managers.Unlink(manager);
            if(manager->numJobsAddedToProcessor == 0)
            {
                Assert(!GetCurrentJobOfManager(manager));
                return;
            }

            // Remove this manager's jobs from the queue
            Job *firstJob = 0;
            for(Job *job = jobs.Head(); job; job = job->Next())
            {
                if(job->Manager() == manager)
                {
                    if(!firstJob)
                        firstJob = job;
                }
                else if(firstJob)
                {
                    jobs.UnlinkSubsequence(firstJob, job->Previous());
                    for(Job *removedJob = firstJob; removedJob;)
                    {
                        Job *const next = removedJob->Next();
                        Assert(!removedJob->IsCritical());
                        Assert(numJobs != 0);
                        --numJobs;
                        JobProcessed(manager, removedJob, false); // the job may be deleted during this and should not be used afterwards
                        Assert(manager->numJobsAddedToProcessor != 0);
                        --manager->numJobsAddedToProcessor;
                        if(manager->isWaitable)
                        {
                            WaitableJobManager *const waitableManager = static_cast<WaitableJobManager *>(manager);
                            if(waitableManager->jobBeingWaitedUpon == removedJob)
                            {
                                waitableManager->jobBeingWaitedUponProcessed.Set();
                                waitableManager->jobBeingWaitedUpon = 0;
                            }
                        }
                        removedJob = next;
                    }
                    firstJob = 0;
                }
            }
            if(firstJob)
            {
                jobs.UnlinkSubsequenceFromEnd(firstJob);
                for(Job *removedJob = firstJob; removedJob;)
                {
                    Job *const next = removedJob->Next();
                    Assert(!removedJob->IsCritical());
                    Assert(numJobs != 0);
                    --numJobs;
                    JobProcessed(manager, removedJob, false); // the job may be deleted during this and should not be used afterwards
                    Assert(manager->numJobsAddedToProcessor != 0);
                    --manager->numJobsAddedToProcessor;
                    if(manager->isWaitable)
                    {
                        WaitableJobManager *const waitableManager = static_cast<WaitableJobManager *>(manager);
                        if(waitableManager->jobBeingWaitedUpon == removedJob)
                        {
                            waitableManager->jobBeingWaitedUponProcessed.Set();
                            waitableManager->jobBeingWaitedUpon = 0;
                        }
                    }
                    removedJob = next;
                }
            }

            if(manager->numJobsAddedToProcessor == 0)
            {
                LastJobProcessed(manager);
                return;
            }

            Assert(manager->numJobsAddedToProcessor >= 1);
            Assert(manager->isWaitable);
            Assert(GetCurrentJobOfManager(manager));

        }

        //Wait for all the on going jobs to complete.
        criticalSection.Enter();
        while (true)
        {
            Job *job = GetCurrentJobOfManager(manager);
            if (!job)
            {
                break;
            }

            WaitableJobManager * const waitableManager = static_cast<WaitableJobManager *>(manager);
            Assert(!waitableManager->jobBeingWaitedUpon);

            waitableManager->jobBeingWaitedUpon = job;
            waitableManager->jobBeingWaitedUponProcessed.Reset();

            threadDataProcessingCurrentJob = GetThreadDataFromCurrentJob(waitableManager->jobBeingWaitedUpon);
            criticalSection.Leave();

            WaitWithThread(threadDataProcessingCurrentJob, waitableManager->jobBeingWaitedUponProcessed);

            criticalSection.Enter();
            waitableManager->jobBeingWaitedUpon = 0;
        }
        criticalSection.Leave();
    }